

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 __thiscall djb::tab_r::u2_to_h2_std_radial(tab_r *this,vec2 *u,float_t zi,float_t param_3)

{
  vec3 vVar1;
  float fVar2;
  float_t fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  float_t z_m;
  float_t tm;
  float_t pm;
  float_t u2;
  float_t u1;
  float_t param_3_local;
  float_t zi_local;
  vec2 *u_local;
  tab_r *this_local;
  undefined4 uStack_10;
  float_t local_c;
  
  u2 = param_3;
  u1 = zi;
  _param_3_local = u;
  u_local = (vec2 *)this;
  pm = qf1(this,u->x,zi);
  tm = qf2(this,_param_3_local->y,pm,u1);
  fVar2 = pm + pm;
  fVar3 = m_pi();
  fVar2 = (fVar2 + -1.0) * fVar3;
  fVar4 = sqr<float>(&tm);
  fVar3 = m_pi();
  fVar4 = fVar4 * fVar3 * 0.5;
  dVar5 = std::sin((double)(ulong)(uint)fVar4);
  dVar6 = std::cos((double)(ulong)(uint)fVar2);
  dVar7 = std::sin((double)(ulong)(uint)fVar2);
  dVar8 = std::cos((double)(ulong)(uint)fVar4);
  vec3::vec3((vec3 *)((long)&this_local + 4),SUB84(dVar5,0) * SUB84(dVar6,0),
             SUB84(dVar5,0) * SUB84(dVar7,0),SUB84(dVar8,0));
  vVar1.z = local_c;
  vVar1.x = (float_t)this_local._4_4_;
  vVar1.y = (float_t)uStack_10;
  return vVar1;
}

Assistant:

vec3 tab_r::u2_to_h2_std_radial(const vec2 &u, float_t zi, float_t) const
{
	float_t u1 = qf1(u.x, zi);
	float_t u2 = qf2(u.y, u1, zi);
	float_t pm = (2 * u1 - 1) * m_pi();
	float_t tm = sqr(u2) * m_pi() / 2;
	float_t z_m = sin(tm);

	return vec3(z_m * cos(pm), z_m * sin(pm), cos(tm));
}